

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::
produce<mvm::value_stack<mvm::list::mplist<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *arg)

{
  bool bVar1;
  reference puVar2;
  value_stack<mvm::list::mplist<unsigned_int>_> *this_00;
  uint local_34;
  iterator iStack_30;
  uint sub;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arg_local;
  interpreter<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
  *this_local;
  
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(arg);
  iStack_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(arg);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    local_34 = *puVar2;
    this_00 = std::
              get<mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>>
                        ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
                          *)(this + 8));
    value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>(this_00,&local_34);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce(T &&arg) {
  if constexpr (concept ::is_tuple_v<std::decay_t<T>>) {
    this->produce_unroll<IS>(
        std::forward<T>(arg),
        std::make_index_sequence<std::tuple_size<T>::value>());
  } else if constexpr (concept ::is_container_valid_v<std::decay_t<T>>) {
    for (auto sub : std::forward<T>(arg)) {
      std::get<IS>(m_instances)
          .template push<typename V::value_type>(std::move(sub));
    }
  } else {
    std::get<IS>(m_instances).template push<V>(std::forward<T>(arg));
  }
}